

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O2

void nn_aws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  nn_epbase *self_01;
  int errnum;
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 uVar4;
  int val;
  uint local_3c;
  size_t sz;
  
  uVar3 = (ulong)(uint)src;
  uVar1 = (ulong)*(uint *)&self[1].fn;
  switch(*(uint *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].srcptr);
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      pcVar2 = "Unexpected action";
      uVar1 = 1;
      uVar3 = 0xfffffffffffffffe;
      uVar4 = 0xa9;
    }
    else {
      pcVar2 = "Unexpected source";
      uVar1 = 1;
      uVar4 = 0xad;
    }
    break;
  case 2:
    if (src == 3) {
      if (type == 6) {
        self_01 = (nn_epbase *)self[1].shutdown_fn;
        errnum = nn_usock_geterrno((nn_usock *)self[8].srcptr);
        nn_epbase_set_error(self_01,errnum);
        nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x6b,1);
        nn_usock_accept((nn_usock *)&self[1].state,(nn_usock *)self[8].srcptr);
        return;
      }
      pcVar2 = "Unexpected action";
      uVar1 = 2;
      uVar3 = 3;
      uVar4 = 0xf8;
    }
    else if (src == 1) {
      if (type == 2) {
        nn_epbase_clear_error((nn_epbase *)self[1].shutdown_fn);
        sz = 4;
        nn_epbase_getopt((nn_epbase *)self[1].shutdown_fn,0,2,&val,&sz);
        if (sz == 4) {
          self_00 = &self[1].state;
          nn_usock_setsockopt((nn_usock *)self_00,1,7,&val,4);
          sz = 4;
          nn_epbase_getopt((nn_epbase *)self[1].shutdown_fn,0,3,&val,&sz);
          if (sz == 4) {
            nn_usock_setsockopt((nn_usock *)self_00,1,8,&val,4);
            sz = 4;
            nn_epbase_getopt((nn_epbase *)self[1].shutdown_fn,-4,1,&val,&sz);
            local_3c = (uint)(byte)val;
            val = 0;
            sz = 4;
            nn_usock_setsockopt((nn_usock *)self_00,1,0x14,&val,4);
            nn_usock_swap_owner((nn_usock *)self[8].srcptr,(nn_fsm_owner *)&self[8].owner);
            self[8].srcptr = (void *)0x0;
            *(undefined4 *)&self[8].owner = 0xffffffff;
            self[8].ctx = (nn_ctx *)0x0;
            nn_fsm_raise(self,(nn_fsm_event *)&self[0x4f].state,0x85b7);
            nn_usock_activate((nn_usock *)self_00);
            nn_sws_start((nn_sws *)&self[8].stopped,(nn_usock *)self_00,2,(char *)0x0,(char *)0x0,
                         (uint8_t)local_3c);
            *(undefined4 *)&self[1].fn = 3;
            nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x66,1);
            return;
          }
          uVar4 = 0xc6;
        }
        else {
          uVar4 = 0xc0;
        }
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
                ,uVar4);
        goto LAB_00126b9f;
      }
      pcVar2 = "Unexpected action";
      uVar1 = 2;
      uVar3 = 1;
      uVar4 = 0xe9;
    }
    else {
      pcVar2 = "Unexpected source";
      uVar1 = 2;
      uVar4 = 0xfc;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 1) {
        nn_sws_stop((nn_sws *)&self[8].stopped);
        *(undefined4 *)&self[1].fn = 4;
        nn_epbase_stat_increment((nn_epbase *)self[1].shutdown_fn,0x68,1);
        return;
      }
      if (type == 2) {
        nn_sws_stop((nn_sws *)&self[8].stopped);
        *(undefined4 *)&self[1].fn = 4;
        return;
      }
      pcVar2 = "Unexpected action";
      uVar1 = 3;
      uVar3 = 2;
      uVar4 = 0x114;
    }
    else {
      pcVar2 = "Unexpected source";
      uVar1 = 3;
      uVar4 = 0x118;
    }
    break;
  case 4:
    if (src == 2) {
      if (type == 8) {
        return;
      }
      if (type == 3) {
        nn_usock_stop((nn_usock *)&self[1].state);
        *(undefined4 *)&self[1].fn = 5;
        return;
      }
      pcVar2 = "Unexpected action";
      uVar1 = 4;
      uVar3 = 2;
      uVar4 = 0x12a;
    }
    else {
      pcVar2 = "Unexpected source";
      uVar1 = 4;
      uVar4 = 0x12e;
    }
    break;
  case 5:
    if (src == 1) {
      if (type == 8) {
        return;
      }
      if (type == 7) {
        nn_fsm_stop(self);
        return;
      }
      pcVar2 = "Unexpected action";
      uVar1 = 5;
      uVar3 = 1;
      uVar4 = 0x13f;
    }
    else {
      pcVar2 = "Unexpected source";
      uVar1 = 5;
      uVar4 = 0x143;
    }
    break;
  default:
    pcVar2 = "Unexpected state";
    uVar4 = 0x14a;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,uVar1,uVar3,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/aws.c"
          ,uVar4);
LAB_00126b9f:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_aws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_aws *aws;
    int val;
    size_t sz;
    uint8_t msg_type;

    aws = nn_cont (self, struct nn_aws, fsm);

    switch (aws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_AWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&aws->usock, aws->listener);
                aws->state = NN_AWS_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_AWS_STATE_ACCEPTING:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_epbase_clear_error (aws->epbase);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_epbase_getopt (aws->epbase, NN_SOL_SOCKET, NN_SNDBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_epbase_getopt (aws->epbase, NN_SOL_SOCKET, NN_RCVBUF,
                    &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_epbase_getopt (aws->epbase, NN_WS, NN_WS_MSG_TYPE,
                    &val, &sz);
                msg_type = (uint8_t)val;

                /*   Since the WebSocket handshake must poll, the receive
                     timeout is set to zero. Later, it will be set again
                     to the value specified by the socket option. */
                val = 0;
                sz = sizeof (val);
                nn_usock_setsockopt (&aws->usock, SOL_SOCKET, SO_RCVTIMEO,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (aws->listener, &aws->listener_owner);
                aws->listener = NULL;
                aws->listener_owner.src = -1;
                aws->listener_owner.fsm = NULL;
                nn_fsm_raise (&aws->fsm, &aws->accepted, NN_AWS_ACCEPTED);

                /*  Start the sws state machine. */
                nn_usock_activate (&aws->usock);
                nn_sws_start (&aws->sws, &aws->usock, NN_WS_SERVER,
                    NULL, NULL, msg_type);
                aws->state = NN_AWS_STATE_ACTIVE;

                nn_epbase_stat_increment (aws->epbase,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        case NN_AWS_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_epbase_set_error (aws->epbase,
                    nn_usock_geterrno (aws->listener));
                nn_epbase_stat_increment (aws->epbase,
                    NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&aws->usock, aws->listener);
                return;

            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_AWS_STATE_ACTIVE:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_SWS_RETURN_CLOSE_HANDSHAKE:
                /*  Peer closed connection without intention to reconnect, or
                    local endpoint failed remote because of invalid data. */
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                return;
            case NN_SWS_RETURN_ERROR:
                nn_sws_stop (&aws->sws);
                aws->state = NN_AWS_STATE_STOPPING_SWS;
                nn_epbase_stat_increment (aws->epbase,
                    NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_SWS state.                                                       */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_SWS:
        switch (src) {

        case NN_AWS_SRC_SWS:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_SWS_RETURN_STOPPED:
                nn_usock_stop (&aws->usock);
                aws->state = NN_AWS_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                     */
/******************************************************************************/
    case NN_AWS_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_AWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_aws_stop (aws);
                return;
            default:
                nn_fsm_bad_action (aws->state, src, type);
            }

        default:
            nn_fsm_bad_source (aws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (aws->state, src, type);
    }
}